

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc_cord_state.cc
# Opt level: O0

void __thiscall absl::lts_20250127::crc_internal::CrcCordState::Normalize(CrcCordState *this)

{
  bool bVar1;
  Rep *pRVar2;
  PrefixCrc local_90;
  uint32_t local_7c;
  uint32_t local_78;
  uint32_t local_74;
  size_t local_70;
  size_t remaining;
  PrefixCrc *prefix_crc;
  iterator __end2;
  iterator __begin2;
  deque<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc,_std::allocator<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc>_>
  *__range2;
  Rep *r;
  CrcCordState *this_local;
  
  bVar1 = IsNormalized(this);
  if (!bVar1) {
    pRVar2 = rep(this);
    bVar1 = std::
            deque<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc,_std::allocator<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc>_>
            ::empty(&pRVar2->prefix_crc);
    if (!bVar1) {
      pRVar2 = mutable_rep(this);
      std::
      deque<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc,_std::allocator<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc>_>
      ::begin((iterator *)&__end2._M_node,&pRVar2->prefix_crc);
      std::
      deque<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc,_std::allocator<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc>_>
      ::end((iterator *)&prefix_crc,&pRVar2->prefix_crc);
      while (bVar1 = std::operator!=((_Self *)&__end2._M_node,(_Self *)&prefix_crc), bVar1) {
        remaining = (size_t)std::
                            _Deque_iterator<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc,_absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc_&,_absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc_*>
                            ::operator*((_Deque_iterator<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc,_absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc_&,_absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc_*>
                                         *)&__end2._M_node);
        local_70 = ((reference)remaining)->length - (pRVar2->removed_prefix).length;
        local_78 = (pRVar2->removed_prefix).crc.crc_;
        local_7c = (((reference)remaining)->crc).crc_;
        local_74 = (uint32_t)RemoveCrc32cPrefix((crc32c_t)local_78,(crc32c_t)local_7c,local_70);
        *(uint32_t *)(remaining + 8) = local_74;
        *(size_t *)remaining = local_70;
        std::
        _Deque_iterator<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc,_absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc_&,_absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc_*>
        ::operator++((_Deque_iterator<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc,_absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc_&,_absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc_*>
                      *)&__end2._M_node);
      }
      memset(&local_90,0,0x10);
      PrefixCrc::PrefixCrc(&local_90);
      (pRVar2->removed_prefix).length = local_90.length;
      (pRVar2->removed_prefix).crc.crc_ = local_90.crc.crc_;
    }
  }
  return;
}

Assistant:

void CrcCordState::Normalize() {
  if (IsNormalized() || rep().prefix_crc.empty()) {
    return;
  }

  Rep* r = mutable_rep();
  for (auto& prefix_crc : r->prefix_crc) {
    size_t remaining = prefix_crc.length - r->removed_prefix.length;
    prefix_crc.crc = absl::RemoveCrc32cPrefix(r->removed_prefix.crc,
                                              prefix_crc.crc, remaining);
    prefix_crc.length = remaining;
  }
  r->removed_prefix = PrefixCrc();
}